

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoLookupManager::rescheduleWithMutexHeld(QHostInfoLookupManager *this)

{
  QList<QHostInfoRunnable_*> *this_00;
  QQueue<QHostInfoRunnable_*> *this_01;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  uint uVar7;
  int i;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_48;
  back_insert_iterator<QList<QHostInfoRunnable_*>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->wasDeleted == false) {
    uVar3 = (this->finishedLookups).d.size;
    if (uVar3 != 0) {
      for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 1) {
        QtPrivate::sequential_erase_with_copy<QList<int>,int>
                  (&this->abortedLookups,&(this->finishedLookups).d.ptr[uVar9]->id);
        uVar3 = (this->finishedLookups).d.size;
      }
      QList<QHostInfoRunnable_*>::clear(&this->finishedLookups);
    }
    this_00 = &this->postponedLookups;
    iVar4 = QList<QHostInfoRunnable_*>::begin(this_00);
    iVar5 = QList<QHostInfoRunnable_*>::end(this_00);
    iVar6 = QList<QHostInfoRunnable_*>::begin(this_00);
    this_01 = &this->scheduledLookups;
    local_48.this = this;
    local_40.container = &this_01->super_QList<QHostInfoRunnable_*>;
    for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
      bVar1 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()(&local_48,*iVar4.i);
      if (bVar1) {
        *iVar6.i = *iVar4.i;
        iVar6.i = iVar6.i + 1;
      }
      else {
        std::front_insert_iterator<QQueue<QHostInfoRunnable_*>_>::operator=
                  ((front_insert_iterator<QQueue<QHostInfoRunnable_*>_> *)&local_40,iVar4.i);
      }
    }
    iVar4 = QList<QHostInfoRunnable_*>::end(this_00);
    QList<QHostInfoRunnable_*>::erase(this_00,(const_iterator)iVar6.i,(const_iterator)iVar4.i);
    iVar4 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar5 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar6 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    local_48.this = this;
    local_40.container = this_00;
    for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
      bVar1 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()(&local_48,*iVar4.i);
      if (bVar1) {
        std::back_insert_iterator<QList<QHostInfoRunnable_*>_>::operator=(&local_40,iVar4.i);
      }
      else {
        *iVar6.i = *iVar4.i;
        iVar6.i = iVar6.i + 1;
      }
    }
    iVar4 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    QList<QHostInfoRunnable_*>::erase
              (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar6.i,
               (const_iterator)iVar4.i);
    iVar2 = QThreadPool::maxThreadCount();
    iVar8 = 1;
    if (1 < iVar2) {
      iVar8 = iVar2;
    }
    uVar7 = iVar8 - (int)(this->currentLookups).d.size;
    if (0 < (int)uVar7) {
      uVar3 = (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size;
      if (uVar3 < uVar7) {
        uVar7 = (uint)uVar3;
      }
      iVar4 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      for (iVar8 = -uVar7; iVar8 != 0; iVar8 = iVar8 + 1) {
        QThreadPool::start((QRunnable *)&this->threadPool,(int)*iVar4.i);
        QList<QHostInfoRunnable_*>::append(&this->currentLookups,*iVar4.i);
        iVar4.i = iVar4.i + 1;
      }
      iVar5 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      QList<QHostInfoRunnable_*>::erase
                (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar5.i,
                 (const_iterator)iVar4.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoLookupManager::rescheduleWithMutexHeld()
{
    if (wasDeleted)
        return;

    // goals of this function:
    //  - launch new lookups via the thread pool
    //  - make sure only one lookup per host/IP is in progress

    if (!finishedLookups.isEmpty()) {
        // remove ID from aborted if it is in there
        for (int i = 0; i < finishedLookups.size(); i++) {
           abortedLookups.removeAll(finishedLookups.at(i)->id);
        }

        finishedLookups.clear();
    }

#if QT_CONFIG(thread)
    auto isAlreadyRunning = [this](QHostInfoRunnable *lookup) {
        return std::any_of(currentLookups.cbegin(), currentLookups.cend(), ToBeLookedUpEquals(lookup->toBeLookedUp));
    };

    // Transfer any postponed lookups that aren't currently running to the scheduled list, keeping already-running lookups:
    postponedLookups.erase(separate_if(postponedLookups.begin(),
                                       postponedLookups.end(),
                                       postponedLookups.begin(),
                                       std::front_inserter(scheduledLookups), // prepend! we want to finish it ASAP
                                       isAlreadyRunning).first,
                           postponedLookups.end());

    // Unschedule and postpone any that are currently running:
    scheduledLookups.erase(separate_if(scheduledLookups.begin(),
                                       scheduledLookups.end(),
                                       std::back_inserter(postponedLookups),
                                       scheduledLookups.begin(),
                                       isAlreadyRunning).second,
                           scheduledLookups.end());

    const int availableThreads = std::max(threadPool.maxThreadCount(), 1) - currentLookups.size();
    if (availableThreads > 0) {
        int readyToStartCount = qMin(availableThreads, scheduledLookups.size());
        auto it = scheduledLookups.begin();
        while (readyToStartCount--) {
            // runnable now running in new thread, track this in currentLookups
            threadPool.start(*it);
            currentLookups.push_back(std::move(*it));
            ++it;
        }
        scheduledLookups.erase(scheduledLookups.begin(), it);
    }
#else
    if (!scheduledLookups.isEmpty())
        scheduledLookups.takeFirst()->run();
#endif
}